

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_matchers_range_equals.hpp
# Opt level: O0

bool __thiscall
Catch::Matchers::RangeEqualsMatcher<std::array<int,2ul>,std::equal_to<void>>::
match<std::vector<int,std::allocator<int>>&>
          (RangeEqualsMatcher<std::array<int,2ul>,std::equal_to<void>> *this,
          vector<int,_std::allocator<int>_> *rng)

{
  bool bVar1;
  const_iterator pvVar2;
  reference __t;
  bool local_59;
  const_iterator target_end;
  const_iterator target_start;
  iterator rng_end;
  iterator rng_start;
  vector<int,_std::allocator<int>_> *rng_local;
  RangeEqualsMatcher<std::array<int,_2UL>,_std::equal_to<void>_> *this_local;
  
  rng_end = std::begin<std::vector<int,std::allocator<int>>>(rng);
  target_start = (const_iterator)std::end<std::vector<int,std::allocator<int>>>(rng);
  target_end = std::begin<std::array<int,2ul>>((array<int,_2UL> *)(this + 0x28));
  pvVar2 = std::end<std::array<int,2ul>>((array<int,_2UL> *)(this + 0x28));
  while( true ) {
    bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                      (&rng_end,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )&target_start);
    if (((bVar1 ^ 0xffU) & 1) == 0 || target_end == pvVar2) {
      local_59 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                           (&rng_end,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)&target_start);
      local_59 = local_59 && target_end == pvVar2;
      return local_59;
    }
    __t = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&rng_end);
    bVar1 = std::equal_to<void>::operator()((equal_to<void> *)(this + 0x30),__t,target_end);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&rng_end);
    target_end = target_end + 1;
  }
  return false;
}

Assistant:

bool match( RangeLike&& rng ) const {
                auto rng_start = begin( rng );
                const auto rng_end = end( rng );
                auto target_start = begin( m_desired );
                const auto target_end = end( m_desired );

                while (rng_start != rng_end && target_start != target_end) {
                    if (!m_predicate(*rng_start, *target_start)) {
                        return false;
                    }
                    ++rng_start;
                    ++target_start;
                }
                return rng_start == rng_end && target_start == target_end;
            }